

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

void __thiscall CppJieba::HMMSegment::HMMSegment(HMMSegment *this,char *filePath)

{
  char *in_RSI;
  undefined8 *in_RDI;
  value_type *__x;
  vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  *this_00;
  SegmentBase *in_stack_ffffffffffffff70;
  allocator local_11;
  char *local_10;
  
  local_10 = in_RSI;
  SegmentBase::SegmentBase(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__HMMSegment_0015cd08;
  std::
  unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>
  ::unordered_map((unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>
                   *)0x135169);
  std::
  unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>
  ::unordered_map((unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>
                   *)0x13517f);
  std::
  unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>
  ::unordered_map((unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>
                   *)0x135195);
  std::
  unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>
  ::unordered_map((unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>
                   *)0x1351ab);
  std::
  vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  ::vector((vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
            *)0x1351c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x35),local_10,&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  __x = (value_type *)0x0;
  this_00 = (vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
             *)0x0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0x42;
  *(undefined1 *)((long)in_RDI + 10) = 0x45;
  *(undefined1 *)((long)in_RDI + 0xb) = 0x4d;
  *(undefined1 *)((long)in_RDI + 0xc) = 0x53;
  std::
  vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  ::push_back((vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
               *)0x0,(value_type *)0x0);
  std::
  vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  ::push_back(this_00,__x);
  std::
  vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  ::push_back(this_00,__x);
  std::
  vector<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_short,_double,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_double>_>_>_*>_>
  ::push_back(this_00,__x);
  return;
}

Assistant:

HMMSegment(const char * const filePath): _hmmModelPath(filePath)
            {
                memset(_startProb, 0, sizeof(_startProb));
                memset(_transProb, 0, sizeof(_transProb));
                _statMap[0] = 'B';
                _statMap[1] = 'E';
                _statMap[2] = 'M';
                _statMap[3] = 'S';
                _emitProbVec.push_back(&_emitProbB);
                _emitProbVec.push_back(&_emitProbE);
                _emitProbVec.push_back(&_emitProbM);
                _emitProbVec.push_back(&_emitProbS);
            }